

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::CloseConnection(SocketWriter *this)

{
  ostream *poVar1;
  int __fd;
  GTestLog local_c;
  
  __fd = this->sockfd_;
  if (__fd == -1) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rangolucas[P]algo2_taller1/tests/gtest-1.8.1/gtest-all.cc"
                       ,0x5d2);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar1,"CloseConnection() can be called only when there is a connection.");
    GTestLog::~GTestLog(&local_c);
    __fd = this->sockfd_;
  }
  close(__fd);
  this->sockfd_ = -1;
  return;
}

Assistant:

void CloseConnection() {
      GTEST_CHECK_(sockfd_ != -1)
          << "CloseConnection() can be called only when there is a connection.";

      close(sockfd_);
      sockfd_ = -1;
    }